

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall
icu_63::MessagePatternList<double,_8>::copyFrom
          (MessagePatternList<double,_8> *this,MessagePatternList<double,_8> *other,int32_t length,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  double *pdVar3;
  double *__src;
  UErrorCode *errorCode_local;
  int32_t length_local;
  MessagePatternList<double,_8> *other_local;
  MessagePatternList<double,_8> *this_local;
  
  UVar1 = ::U_SUCCESS(*errorCode);
  if ((UVar1 != '\0') && (0 < length)) {
    iVar2 = MaybeStackArray<double,_8>::getCapacity(&this->a);
    if ((iVar2 < length) &&
       (pdVar3 = MaybeStackArray<double,_8>::resize(&this->a,length,0), pdVar3 == (double *)0x0)) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    pdVar3 = MaybeStackArray<double,_8>::getAlias(&this->a);
    __src = MaybeStackArray<double,_8>::getAlias(&other->a);
    memcpy(pdVar3,__src,(long)length << 3);
  }
  return;
}

Assistant:

void
MessagePatternList<T, stackCapacity>::copyFrom(
        const MessagePatternList<T, stackCapacity> &other,
        int32_t length,
        UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && length>0) {
        if(length>a.getCapacity() && NULL==a.resize(length)) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        uprv_memcpy(a.getAlias(), other.a.getAlias(), (size_t)length*sizeof(T));
    }
}